

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void readWriteArrayExample(ostream *out,AdsDevice *route)

{
  ostream *poVar1;
  byte *pbVar2;
  array<unsigned_char,_4UL> local_88 [2];
  array<unsigned_char,_4UL> readArray;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  AdsVariable<std::array<unsigned_char,_4UL>_> arrayVar;
  AdsDevice *route_local;
  ostream *out_local;
  
  arrayVar.m_Handle._M_t.super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)route;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"MAIN.byByte",&local_71);
  AdsVariable<std::array<unsigned_char,_4UL>_>::AdsVariable
            ((AdsVariable<std::array<unsigned_char,_4UL>_> *)local_50,route,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  AdsVariable<std::array<unsigned_char,_4UL>_>::operator=
            ((AdsVariable<std::array<unsigned_char,_4UL>_> *)local_50,
             &readWriteArrayExample::arrayToWrite);
  local_88[0] = AdsVariable::operator_cast_to_array((AdsVariable *)local_50);
  poVar1 = std::operator<<(out,"Wrote array with first value ");
  pbVar2 = std::array<unsigned_char,_4UL>::operator[](&readWriteArrayExample::arrayToWrite,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  poVar1 = std::operator<<(poVar1," and last value ");
  pbVar2 = std::array<unsigned_char,_4UL>::operator[](&readWriteArrayExample::arrayToWrite,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(out,"Read back array with first value ");
  pbVar2 = std::array<unsigned_char,_4UL>::operator[](local_88,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  poVar1 = std::operator<<(poVar1," and last value ");
  pbVar2 = std::array<unsigned_char,_4UL>::operator[](local_88,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  std::operator<<(poVar1,"\n");
  AdsVariable<std::array<unsigned_char,_4UL>_>::~AdsVariable
            ((AdsVariable<std::array<unsigned_char,_4UL>_> *)local_50);
  return;
}

Assistant:

static void readWriteArrayExample(std::ostream& out, const AdsDevice& route)
{
    static const std::array<uint8_t, 4> arrayToWrite = { 1, 2, 3, 4 };
    AdsVariable<std::array<uint8_t, 4> > arrayVar {route, "MAIN.byByte"};
    arrayVar = arrayToWrite;
    std::array<uint8_t, 4> readArray = arrayVar;
    out << "Wrote array with first value " << (uint32_t)arrayToWrite[0] << " and last value " <<
        (uint32_t)arrayToWrite[3] << "\n";
    out << "Read back array with first value " << (uint32_t)readArray[0] << " and last value " <<
        (uint32_t)readArray[3] << "\n";
}